

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O1

void test_server_init(void)

{
  byte bVar1;
  int iVar2;
  cio_http_server *server_00;
  cio_eventloop *loop;
  cio_error cVar3;
  cio_inet_address *arg1;
  long lVar4;
  server_init_arguments server_init_arguments [11];
  cio_http_server_configuration config;
  cio_http_server server;
  uint64_t auStack_5f4 [9];
  byte abStack_5ac [4];
  undefined1 *local_5a8;
  cio_eventloop *local_5a0;
  code *local_598;
  undefined8 local_590;
  undefined8 local_588;
  undefined8 local_580;
  code *local_578;
  code *local_570;
  code *local_568;
  undefined1 local_560;
  undefined4 local_55c;
  undefined1 *local_558;
  cio_eventloop *local_550;
  code *local_548;
  undefined8 local_540;
  undefined8 local_538;
  undefined8 local_530;
  code *local_528;
  code *local_520;
  code *local_518;
  undefined1 local_510;
  undefined4 local_50c;
  undefined8 local_508;
  cio_eventloop *local_500;
  code *local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  code *local_4d8;
  code *local_4d0;
  code *local_4c8;
  undefined1 local_4c0;
  undefined4 local_4bc;
  undefined1 *local_4b8;
  undefined8 local_4b0;
  code *local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  code *local_488;
  code *local_480;
  code *local_478;
  undefined1 local_470;
  undefined4 local_46c;
  undefined1 *local_468;
  cio_eventloop *local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  code *local_438;
  code *local_430;
  code *local_428;
  undefined1 local_420;
  undefined4 local_41c;
  undefined1 *local_418;
  cio_eventloop *local_410;
  code *local_408;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  code *local_3e8;
  code *local_3e0;
  code *local_3d8;
  undefined1 local_3d0;
  undefined4 local_3cc;
  undefined1 *local_3c8;
  cio_eventloop *local_3c0;
  code *local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  code *local_398;
  code *local_390;
  code *local_388;
  undefined1 local_380;
  undefined4 local_37c;
  undefined1 *local_378;
  cio_eventloop *local_370;
  code *local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  code *local_348;
  code *local_340;
  code *local_338;
  undefined1 local_330;
  undefined4 local_32c;
  undefined1 *local_328;
  cio_eventloop *local_320;
  code *local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  code *local_2f0;
  code *local_2e8;
  undefined1 local_2e0;
  undefined4 local_2dc;
  undefined1 *local_2d8;
  cio_eventloop *local_2d0;
  code *local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  code *local_2a8;
  undefined8 local_2a0;
  code *local_298;
  undefined1 local_290;
  undefined4 local_28c;
  undefined1 *local_288;
  cio_eventloop *local_280;
  code *local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  code *local_258;
  code *local_250;
  code *local_248;
  undefined1 local_240;
  undefined4 local_23c;
  cio_http_server_configuration local_238;
  undefined1 local_180 [336];
  
  local_5a8 = local_180;
  local_5a0 = &::loop;
  local_598 = serve_error;
  local_590 = 5000000000;
  local_588 = 5000000000;
  local_580 = 5000000000;
  local_578 = alloc_dummy_client;
  local_570 = free_dummy_client;
  local_568 = cio_server_socket_init_ok;
  local_560 = 0;
  local_55c = 0;
  local_558 = local_180;
  local_550 = &::loop;
  local_548 = serve_error;
  local_540 = 5000000000;
  local_538 = 5000000000;
  local_530 = 5000000000;
  local_528 = alloc_dummy_client;
  local_520 = free_dummy_client;
  local_518 = cio_server_socket_init_ok;
  local_510 = 1;
  local_50c = 0;
  local_508 = 0;
  local_500 = &::loop;
  local_4f8 = serve_error;
  local_4f0 = 5000000000;
  local_4e8 = 5000000000;
  local_4e0 = 5000000000;
  local_4d8 = alloc_dummy_client;
  local_4d0 = free_dummy_client;
  local_4c8 = cio_server_socket_init_ok;
  local_4c0 = 0;
  local_4bc = 0xffffffea;
  local_4b8 = local_180;
  local_4b0 = 0;
  local_4a8 = serve_error;
  local_4a0 = 5000000000;
  local_498 = 5000000000;
  local_490 = 5000000000;
  local_488 = alloc_dummy_client;
  local_480 = free_dummy_client;
  local_478 = cio_server_socket_init_ok;
  local_470 = 0;
  local_46c = 0xffffffea;
  local_468 = local_180;
  local_460 = &::loop;
  local_458 = 0;
  local_450 = 5000000000;
  local_448 = 5000000000;
  local_440 = 5000000000;
  local_438 = alloc_dummy_client;
  local_430 = free_dummy_client;
  local_428 = cio_server_socket_init_ok;
  local_420 = 0;
  local_41c = 0;
  local_418 = local_180;
  local_410 = &::loop;
  local_408 = serve_error;
  local_400 = 0;
  local_3f8 = 5000000000;
  local_3f0 = 5000000000;
  local_3e8 = alloc_dummy_client;
  local_3e0 = free_dummy_client;
  local_3d8 = cio_server_socket_init_ok;
  local_3d0 = 0;
  local_3cc = 0xffffffea;
  local_3c8 = local_180;
  local_3c0 = &::loop;
  local_3b8 = serve_error;
  local_3b0 = 5000000000;
  local_3a8 = 0;
  local_3a0 = 5000000000;
  local_398 = alloc_dummy_client;
  local_390 = free_dummy_client;
  local_388 = cio_server_socket_init_ok;
  local_380 = 0;
  local_37c = 0xffffffea;
  local_378 = local_180;
  local_370 = &::loop;
  local_368 = serve_error;
  local_360 = 5000000000;
  local_358 = 5000000000;
  local_350 = 0;
  local_348 = alloc_dummy_client;
  local_340 = free_dummy_client;
  local_338 = cio_server_socket_init_ok;
  local_330 = 0;
  local_32c = 0xffffffea;
  local_328 = local_180;
  local_320 = &::loop;
  local_318 = serve_error;
  local_310 = 5000000000;
  local_308 = 5000000000;
  local_300 = 5000000000;
  local_2f8 = 0;
  local_2f0 = free_dummy_client;
  local_2e8 = cio_server_socket_init_ok;
  local_2e0 = 0;
  local_2dc = 0xffffffea;
  local_2d8 = local_180;
  local_2d0 = &::loop;
  local_2c8 = serve_error;
  local_2c0 = 5000000000;
  local_2b8 = 5000000000;
  local_2b0 = 5000000000;
  local_2a8 = alloc_dummy_client;
  local_2a0 = 0;
  local_298 = cio_server_socket_init_ok;
  local_290 = 0;
  local_28c = 0xffffffea;
  local_288 = local_180;
  local_280 = &::loop;
  local_278 = serve_error;
  local_270 = 5000000000;
  local_268 = 5000000000;
  local_260 = 5000000000;
  local_258 = alloc_dummy_client;
  local_250 = free_dummy_client;
  local_248 = cio_server_socket_init_fails;
  local_240 = 0;
  local_23c = 0xffffffea;
  lVar4 = 0x4c;
  do {
    server_00 = *(cio_http_server **)((long)auStack_5f4 + lVar4);
    loop = *(cio_eventloop **)((long)auStack_5f4 + lVar4 + 8);
    local_238.on_error = *(cio_http_serve_on_error_t *)((long)auStack_5f4 + lVar4 + 0x10);
    local_238.read_header_timeout_ns = *(uint64_t *)((long)auStack_5f4 + lVar4 + 0x18);
    local_238.read_body_timeout_ns = *(uint64_t *)((long)auStack_5f4 + lVar4 + 0x20);
    local_238.response_timeout_ns = *(uint64_t *)((long)auStack_5f4 + lVar4 + 0x28);
    local_238.alloc_client = *(cio_alloc_client_t *)((long)auStack_5f4 + lVar4 + 0x30);
    local_238.free_client = *(cio_free_client_t *)((long)auStack_5f4 + lVar4 + 0x38);
    cio_server_socket_init_fake.custom_fake =
         *(_func_cio_error_cio_server_socket_ptr_cio_eventloop_ptr_uint_cio_address_family_cio_alloc_client_t_cio_free_client_t_uint64_t_cio_server_socket_close_hook_t
           **)((long)auStack_5f4 + lVar4 + 0x40);
    bVar1 = abStack_5ac[lVar4];
    iVar2 = *(int *)((long)&local_5a8 + lVar4);
    local_238.endpoint.impl.sa._92_8_ = 0;
    local_238.endpoint.impl.sa._100_8_ = 0;
    local_238.endpoint.impl.sa._76_8_ = 0;
    local_238.endpoint.impl.sa._84_8_ = 0;
    local_238.endpoint.impl.sa._60_8_ = 0;
    local_238.endpoint.impl.sa._68_8_ = 0;
    local_238.endpoint.impl.sa._44_8_ = 0;
    local_238.endpoint.impl.sa._52_8_ = 0;
    local_238.endpoint.impl.sa._28_8_ = 0;
    local_238.endpoint.impl.sa._36_8_ = 0;
    local_238.endpoint.impl.sa._12_8_ = 0;
    local_238.endpoint.impl.sa._20_8_ = 0;
    local_238.endpoint.impl._0_8_ = 0;
    local_238.endpoint.impl.sa._4_8_ = 0;
    local_238.endpoint.impl.sa._108_4_ = 0;
    local_238.close_timeout_ns = 10;
    local_238.use_tcp_fastopen = (_Bool)(bVar1 & 1);
    stack0xfffffffffffffa50 = 0x10770a;
    arg1 = cio_get_inet_address_any4();
    stack0xfffffffffffffa50 = 0x10771a;
    cio_init_inet_socket_address(&local_238.endpoint,arg1,0x1f90);
    stack0xfffffffffffffa50 = 0x107728;
    cVar3 = cio_http_server_init(server_00,loop,&local_238);
    stack0xfffffffffffffa50 = 0x107745;
    UnityAssertEqualNumber
              ((long)iVar2,(long)cVar3,"Initialization failed!",0x3da,UNITY_DISPLAY_STYLE_INT);
    if ((bVar1 & 1) != 0) {
      stack0xfffffffffffffa50 = 0x10776d;
      UnityAssertEqualNumber
                (1,(ulong)cio_server_socket_set_tcp_fast_open_fake.call_count,
                 "TCP FAST OPEN was not configured!",0x3dc,UNITY_DISPLAY_STYLE_INT);
    }
    stack0xfffffffffffffa50 = 0x107783;
    free(&client_socket[-2].impl.close_timer.impl.ev.fd);
    stack0xfffffffffffffa50 = 0x107788;
    setUp();
    lVar4 = lVar4 + 0x50;
  } while (lVar4 != 0x3bc);
  stack0xfffffffffffffa50 = 0x1077ac;
  free(&client_socket[-2].impl.close_timer.impl.ev.fd);
  return;
}

Assistant:

static void test_server_init(void)
{
	struct server_init_arguments {
		struct cio_http_server *server;
		struct cio_eventloop *loop;
		void (*serve_error)(struct cio_http_server *server, const char *reason);
		uint64_t header_read_timeout;
		uint64_t body_read_timeout;
		uint64_t response_timeout;
		struct cio_socket *(*alloc_client)(void);
		void (*free_client)(struct cio_socket *socket);
		enum cio_error (*server_socket_init)(struct cio_server_socket *ss, struct cio_eventloop *loop, unsigned int backlog, enum cio_address_family family, cio_alloc_client_t alloc_client, cio_free_client_t free_client, uint64_t close_timeout_ns, cio_server_socket_close_hook_t close_hook);
		bool enable_fast_open;
		enum cio_error expected_result;
	};

	struct cio_http_server server;
	struct server_init_arguments server_init_arguments[] = {
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_SUCCESS},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = true, .expected_result = CIO_SUCCESS},
	    {.server = NULL, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = NULL, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = NULL, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_SUCCESS},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = 0, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = 0, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = 0, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = NULL, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = NULL, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_fails, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(server_init_arguments); i++) {
		struct server_init_arguments args = server_init_arguments[i];
		cio_server_socket_init_fake.custom_fake = args.server_socket_init;

		struct cio_http_server_configuration config = {
		    .on_error = args.serve_error,
		    .read_header_timeout_ns = args.header_read_timeout,
		    .read_body_timeout_ns = args.body_read_timeout,
		    .response_timeout_ns = args.response_timeout,
		    .close_timeout_ns = 10,
		    .use_tcp_fastopen = args.enable_fast_open,
		    .alloc_client = args.alloc_client,
		    .free_client = args.free_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

		enum cio_error err = cio_http_server_init(args.server, args.loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(args.expected_result, err, "Initialization failed!");
		if (args.enable_fast_open) {
			TEST_ASSERT_EQUAL_MESSAGE(1, cio_server_socket_set_tcp_fast_open_fake.call_count, "TCP FAST OPEN was not configured!");
		}

		free_dummy_client(client_socket);
		setUp();
	}

	free_dummy_client(client_socket);
}